

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateOneofCaseDefinition
          (Generator *this,GeneratorOptions *options,Printer *printer,OneofDescriptor *oneof)

{
  int iVar1;
  undefined8 *puVar2;
  OneofDescriptor *oneof_00;
  FieldDescriptor *field;
  OneofDescriptor *oneof_01;
  OneofDescriptor *oneof_02;
  long lVar3;
  string local_98;
  string local_78;
  string local_58;
  GeneratorOptions *local_38;
  
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_78,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
             (GeneratorOptions *)(options->namespace_prefix)._M_string_length,
             *(Descriptor **)(oneof + 0x10));
  (anonymous_namespace)::JSOneofName_abi_cxx11_(&local_98,*(_anonymous_namespace_ **)oneof,oneof_00)
  ;
  anon_unknown_0::ToEnumCase(&local_58,*(string **)oneof);
  io::Printer::Print(printer,
                     "/**\n * @enum {number}\n */\n$classname$.$oneof$Case = {\n  $upcase$_NOT_SET: 0"
                     ,"classname",&local_78,"oneof",&local_98,"upcase",&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_38 = options;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (0 < *(int *)(oneof + 0x1c)) {
    lVar3 = 0;
    do {
      puVar2 = *(undefined8 **)(*(long *)(oneof + 0x20) + lVar3 * 8);
      if (*(char *)(puVar2 + 10) == '\x01') {
        iVar1 = std::__cxx11::string::compare((char *)**(undefined8 **)(puVar2[0xb] + 0x10));
        if (iVar1 != 0) {
          puVar2 = *(undefined8 **)(*(long *)(oneof + 0x20) + lVar3 * 8);
          goto LAB_002214cc;
        }
      }
      else {
LAB_002214cc:
        anon_unknown_0::ToEnumCase(&local_78,(string *)*puVar2);
        (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                  (&local_98,*(_anonymous_namespace_ **)(*(long *)(oneof + 0x20) + lVar3 * 8),field)
        ;
        io::Printer::Print(printer,",\n  $upcase$: $number$","upcase",&local_78,"number",&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < *(int *)(oneof + 0x1c));
  }
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_78,(_anonymous_namespace_ *)(local_38->namespace_prefix)._M_dataplus._M_p,
             (GeneratorOptions *)(local_38->namespace_prefix)._M_string_length,
             *(Descriptor **)(oneof + 0x10));
  (anonymous_namespace)::JSOneofName_abi_cxx11_(&local_98,*(_anonymous_namespace_ **)oneof,oneof_01)
  ;
  (anonymous_namespace)::JSOneofIndex_abi_cxx11_(&local_58,(_anonymous_namespace_ *)oneof,oneof_02);
  io::Printer::Print(printer,
                     "\n};\n\n/**\n * @return {$class$.$oneof$Case}\n */\n$class$.prototype.get$oneof$Case = function() {\n  return /** @type {$class$.$oneof$Case} */(jspb.Message.computeOneofCase(this, $class$.oneofGroups_[$oneofindex$]));\n};\n\n"
                     ,"class",&local_78,"oneof",&local_98,"oneofindex",&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Generator::GenerateOneofCaseDefinition(
    const GeneratorOptions& options,
    io::Printer* printer,
    const OneofDescriptor* oneof) const {
  printer->Print(
      "/**\n"
      " * @enum {number}\n"
      " */\n"
      "$classname$.$oneof$Case = {\n"
      "  $upcase$_NOT_SET: 0",
      "classname", GetMessagePath(options, oneof->containing_type()),
      "oneof", JSOneofName(oneof),
      "upcase", ToEnumCase(oneof->name()));

  for (int i = 0; i < oneof->field_count(); i++) {
    if (IgnoreField(oneof->field(i))) {
      continue;
    }

    printer->Print(
        ",\n"
        "  $upcase$: $number$",
        "upcase", ToEnumCase(oneof->field(i)->name()),
        "number", JSFieldIndex(oneof->field(i)));
  }

  printer->Print(
      "\n"
      "};\n"
      "\n"
      "/**\n"
      " * @return {$class$.$oneof$Case}\n"
      " */\n"
      "$class$.prototype.get$oneof$Case = function() {\n"
      "  return /** @type {$class$.$oneof$Case} */(jspb.Message."
      "computeOneofCase(this, $class$.oneofGroups_[$oneofindex$]));\n"
      "};\n"
      "\n",
      "class", GetMessagePath(options, oneof->containing_type()),
      "oneof", JSOneofName(oneof),
      "oneofindex", JSOneofIndex(oneof));
}